

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void random_read(void *vbuf,size_t size)

{
  uint8_t *puVar1;
  uint8_t *local_20;
  uint8_t *buf;
  size_t size_local;
  void *vbuf_local;
  
  local_20 = (uint8_t *)vbuf;
  buf = (uint8_t *)size;
  if (random_seedstr == (char *)0x0) {
    __assert_fail("random_seedstr",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testsc.c",
                  0x82,"void random_read(void *, size_t)");
  }
  while (buf != (uint8_t *)0x0) {
    if (random_buf_limit == 0) {
      random_advance_counter();
    }
    puVar1 = random_buf + random_buf_limit;
    random_buf_limit = random_buf_limit - 1;
    *local_20 = *puVar1;
    local_20 = local_20 + 1;
    buf = buf + -1;
  }
  return;
}

Assistant:

void random_read(void *vbuf, size_t size)
{
    assert(random_seedstr);
    uint8_t *buf = (uint8_t *)vbuf;
    while (size-- > 0) {
        if (random_buf_limit == 0)
            random_advance_counter();
        *buf++ = random_buf[random_buf_limit--];
    }
}